

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O0

void __thiscall AnalyserUnits_powerValues_Test::TestBody(AnalyserUnits_powerValues_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f50;
  shared_ptr<libcellml::Logger> local_a80;
  ScopedTrace local_a69;
  undefined1 local_a68 [7];
  ScopedTrace gtest_trace_896;
  AnalyserPtr analyser;
  allocator<char> local_a50;
  allocator<char> local_a4f;
  allocator<char> local_a4e;
  allocator<char> local_a4d;
  allocator<char> local_a4c;
  allocator<char> local_a4b;
  allocator<char> local_a4a;
  allocator<char> local_a49;
  allocator<char> local_a48;
  allocator<char> local_a47;
  allocator<char> local_a46;
  allocator<char> local_a45;
  allocator<char> local_a44;
  allocator<char> local_a43;
  allocator<char> local_a42;
  allocator<char> local_a41;
  allocator<char> local_a40;
  allocator<char> local_a3f;
  allocator<char> local_a3e;
  allocator<char> local_a3d;
  allocator<char> local_a3c;
  allocator<char> local_a3b;
  allocator<char> local_a3a;
  allocator<char> local_a39;
  allocator<char> local_a38;
  allocator<char> local_a37;
  allocator<char> local_a36;
  allocator<char> local_a35;
  allocator<char> local_a34;
  allocator<char> local_a33;
  allocator<char> local_a32;
  allocator<char> local_a31;
  allocator<char> local_a30;
  allocator<char> local_a2f;
  allocator<char> local_a2e;
  allocator<char> local_a2d;
  allocator<char> local_a2c;
  allocator<char> local_a2b;
  allocator<char> local_a2a;
  allocator<char> local_a29;
  allocator<char> local_a28;
  allocator<char> local_a27;
  allocator<char> local_a26;
  allocator<char> local_a25;
  allocator<char> local_a24;
  allocator<char> local_a23;
  allocator<char> local_a22;
  allocator<char> local_a21;
  allocator<char> local_a20;
  allocator<char> local_a1f;
  allocator<char> local_a1e;
  allocator<char> local_a1d;
  allocator<char> local_a1c;
  allocator<char> local_a1b;
  allocator<char> local_a1a;
  allocator<char> local_a19;
  allocator<char> local_a18;
  allocator<char> local_a17;
  allocator<char> local_a16;
  allocator<char> local_a15;
  allocator<char> local_a14;
  allocator<char> local_a13;
  allocator<char> local_a12;
  allocator<char> local_a11;
  allocator<char> local_a10;
  allocator<char> local_a0f;
  allocator<char> local_a0e;
  allocator<char> local_a0d;
  allocator<char> local_a0c;
  allocator<char> local_a0b;
  allocator<char> local_a0a;
  allocator<char> local_a09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  iterator local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  AnalyserUnits_powerValues_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"analyser/units/power_values.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x32e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &expectedIssues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 1;
  local_a08 = &local_a00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a00,
             "The units in \'eqnEq = pow(x, 3.0 == 5.0)\' in component \'my_component\' are not equivalent. \'eqnEq\' is in \'second\' while \'pow(x, 3.0 == 5.0)\' is \'dimensionless\'."
             ,&local_a09);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9e0,
             "The units in \'eqnGt = pow(x, 3.0 > 5.0)\' in component \'my_component\' are not equivalent. \'eqnGt\' is in \'second\' while \'pow(x, 3.0 > 5.0)\' is \'dimensionless\'."
             ,&local_a0a);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9c0,
             "The units in \'eqnGeq = pow(x, 3.0 >= 5.0)\' in component \'my_component\' are not equivalent. \'eqnGeq\' is in \'second\' while \'pow(x, 3.0 >= 5.0)\' is \'dimensionless\'."
             ,&local_a0b);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_9a0,
             "The units in \'eqnAnd2 = pow(x, !3.0 && 5.0)\' in component \'my_component\' are not equivalent. \'eqnAnd2\' is in \'second\' while \'pow(x, !3.0 && 5.0)\' is \'dimensionless\'."
             ,&local_a0c);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_980;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_980,
             "The units in \'eqnAnd3 = pow(x, 3.0 && !5.0)\' in component \'my_component\' are not equivalent. \'eqnAnd3\' is in \'second\' while \'pow(x, 3.0 && !5.0)\' is \'dimensionless\'."
             ,&local_a0d);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_960,
             "The units in \'eqnOr3 = pow(x, !3.0 || !5.0)\' in component \'my_component\' are not equivalent. \'eqnOr3\' is in \'second\' while \'pow(x, !3.0 || !5.0)\' is \'dimensionless\'."
             ,&local_a0e);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_940,
             "The units in \'eqnXor = pow(x, xor(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnXor\' is in \'second\' while \'pow(x, xor(3.0, 5.0))\' is \'dimensionless\'."
             ,&local_a0f);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_920;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_920,
             "The units in \'eqnNot = pow(x, !3.0)\' in component \'my_component\' are not equivalent. \'eqnNot\' is in \'second\' while \'pow(x, !3.0)\' is \'dimensionless\'."
             ,&local_a10);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_900,
             "The units in \'eqnPlus = pow(x, 3.0)\' in component \'my_component\' are not equivalent. \'eqnPlus\' is in \'second\' while \'pow(x, 3.0)\' is in \'second^3\'."
             ,&local_a11);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e0,
             "The units in \'eqnPlus2 = pow(x, 3.0+5.0)\' in component \'my_component\' are not equivalent. \'eqnPlus2\' is in \'second\' while \'pow(x, 3.0+5.0)\' is in \'second^8\'."
             ,&local_a12);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8c0,
             "The units in \'eqnMinus = pow(x, -3.0)\' in component \'my_component\' are not equivalent. \'eqnMinus\' is in \'second\' while \'pow(x, -3.0)\' is in \'second^-3\'."
             ,&local_a13);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8a0,
             "The units in \'eqnMinus2 = pow(x, 3.0-5.0)\' in component \'my_component\' are not equivalent. \'eqnMinus2\' is in \'second\' while \'pow(x, 3.0-5.0)\' is in \'second^-2\'."
             ,&local_a14);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_880,
             "The units in \'eqnTimes = pow(x, 3.0*5.0)\' in component \'my_component\' are not equivalent. \'eqnTimes\' is in \'second\' while \'pow(x, 3.0*5.0)\' is in \'second^15\'."
             ,&local_a15);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_860;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_860,
             "The units in \'eqnDivide = pow(x, 3.0/5.0)\' in component \'my_component\' are not equivalent. \'eqnDivide\' is in \'second\' while \'pow(x, 3.0/5.0)\' is in \'second^0.6\'."
             ,&local_a16);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_840,
             "The units in \'eqnPower = pow(x, pow(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnPower\' is in \'second\' while \'pow(x, pow(3.0, 5.0))\' is in \'second^243\'."
             ,&local_a17);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_820,
             "The units in \'eqnRoot = pow(x, pow(3.0, 1.0/5.0))\' in component \'my_component\' are not equivalent. \'eqnRoot\' is in \'second\' while \'pow(x, pow(3.0, 1.0/5.0))\' is in \'second^1.24573\'."
             ,&local_a18);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_800;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_800,
             "The units in \'eqnRoot2 = pow(x, sqrt(3.0))\' in component \'my_component\' are not equivalent. \'eqnRoot2\' is in \'second\' while \'pow(x, sqrt(3.0))\' is in \'second^1.73205\'."
             ,&local_a19);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7e0,
             "The units in \'eqnAbs = pow(x, abs(-3.0))\' in component \'my_component\' are not equivalent. \'eqnAbs\' is in \'second\' while \'pow(x, abs(-3.0))\' is in \'second^3\'."
             ,&local_a1a);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7c0,
             "The units in \'eqnExp = pow(x, exp(3.0))\' in component \'my_component\' are not equivalent. \'eqnExp\' is in \'second\' while \'pow(x, exp(3.0))\' is in \'second^20.0855\'."
             ,&local_a1b);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a0,
             "The units in \'eqnLn = pow(x, ln(3.0))\' in component \'my_component\' are not equivalent. \'eqnLn\' is in \'second\' while \'pow(x, ln(3.0))\' is in \'second^1.09861\'."
             ,&local_a1c);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_780,
             "The units in \'eqnLog = pow(x, log(3.0))\' in component \'my_component\' are not equivalent. \'eqnLog\' is in \'second\' while \'pow(x, log(3.0))\' is in \'second^0.477121\'."
             ,&local_a1d);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_760,
             "The units in \'eqnLog2 = pow(x, ln(3.0)/ln(2.0))\' in component \'my_component\' are not equivalent. \'eqnLog2\' is in \'second\' while \'pow(x, ln(3.0)/ln(2.0))\' is in \'second^1.58496\'."
             ,&local_a1e);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_740,
             "The units in \'eqnLog10 = pow(x, log(3.0))\' in component \'my_component\' are not equivalent. \'eqnLog10\' is in \'second\' while \'pow(x, log(3.0))\' is in \'second^0.477121\'."
             ,&local_a1f);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_720,
             "The units in \'eqnCeiling = pow(x, ceil(3.21))\' in component \'my_component\' are not equivalent. \'eqnCeiling\' is in \'second\' while \'pow(x, ceil(3.21))\' is in \'second^4\'."
             ,&local_a20);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_700,
             "The units in \'eqnFloor = pow(x, floor(3.21))\' in component \'my_component\' are not equivalent. \'eqnFloor\' is in \'second\' while \'pow(x, floor(3.21))\' is in \'second^3\'."
             ,&local_a21);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e0,
             "The units in \'eqnMin = pow(x, min(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnMin\' is in \'second\' while \'pow(x, min(3.0, 5.0))\' is in \'second^3\'."
             ,&local_a22);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6c0,
             "The units in \'eqnMin2 = pow(x, min(5.0, 3.0))\' in component \'my_component\' are not equivalent. \'eqnMin2\' is in \'second\' while \'pow(x, min(5.0, 3.0))\' is in \'second^3\'."
             ,&local_a23);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_6a0,
             "The units in \'eqnMax = pow(x, max(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnMax\' is in \'second\' while \'pow(x, max(3.0, 5.0))\' is in \'second^5\'."
             ,&local_a24);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_680,
             "The units in \'eqnMax2 = pow(x, max(5.0, 3.0))\' in component \'my_component\' are not equivalent. \'eqnMax2\' is in \'second\' while \'pow(x, max(5.0, 3.0))\' is in \'second^5\'."
             ,&local_a25);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_660,
             "The units in \'eqnRem = pow(x, rem(3.0, 5.0))\' in component \'my_component\' are not equivalent. \'eqnRem\' is in \'second\' while \'pow(x, rem(3.0, 5.0))\' is in \'second^3\'."
             ,&local_a26);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_640,
             "The units in \'eqnDiff = pow(x, dx/dt)\' in component \'my_component\' may not be equivalent. \'eqnDiff\' is in \'second\' while \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units."
             ,&local_a27);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_620,
             "The units in \'pow(x, dx/dt) = eqnDiff2\' in component \'my_component\' may not be equivalent. \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units while \'eqnDiff2\' is in \'second\'."
             ,&local_a28);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_600,
             "The units in \'pow(x, dx/dt) = pow(xx, dxx/dt)\' in component \'my_component\' may not be equivalent. \'dx/dt\' may result in \'pow(x, dx/dt)\' having different units while \'dxx/dt\' may result in \'pow(xx, dxx/dt)\' having different units."
             ,&local_a29);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e0,
             "The units in \'eqnSin = pow(x, sin(3.0))\' in component \'my_component\' are not equivalent. \'eqnSin\' is in \'second\' while \'pow(x, sin(3.0))\' is in \'second^0.14112\'."
             ,&local_a2a);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c0,
             "The units in \'eqnCos = pow(x, cos(3.0))\' in component \'my_component\' are not equivalent. \'eqnCos\' is in \'second\' while \'pow(x, cos(3.0))\' is in \'second^-0.989992\'."
             ,&local_a2b);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5a0,
             "The units in \'eqnTan = pow(x, tan(3.0))\' in component \'my_component\' are not equivalent. \'eqnTan\' is in \'second\' while \'pow(x, tan(3.0))\' is in \'second^-0.142547\'."
             ,&local_a2c);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_580,
             "The units in \'eqnSec = pow(x, sec(3.0))\' in component \'my_component\' are not equivalent. \'eqnSec\' is in \'second\' while \'pow(x, sec(3.0))\' is in \'second^-1.01011\'."
             ,&local_a2d);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_560,
             "The units in \'eqnCsc = pow(x, csc(3.0))\' in component \'my_component\' are not equivalent. \'eqnCsc\' is in \'second\' while \'pow(x, csc(3.0))\' is in \'second^7.08617\'."
             ,&local_a2e);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_540,
             "The units in \'eqnCot = pow(x, cot(3.0))\' in component \'my_component\' are not equivalent. \'eqnCot\' is in \'second\' while \'pow(x, cot(3.0))\' is in \'second^-7.01525\'."
             ,&local_a2f);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_520,
             "The units in \'eqnSinh = pow(x, sinh(3.0))\' in component \'my_component\' are not equivalent. \'eqnSinh\' is in \'second\' while \'pow(x, sinh(3.0))\' is in \'second^10.0179\'."
             ,&local_a30);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_500,
             "The units in \'eqnCosh = pow(x, cosh(3.0))\' in component \'my_component\' are not equivalent. \'eqnCosh\' is in \'second\' while \'pow(x, cosh(3.0))\' is in \'second^10.0677\'."
             ,&local_a31);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4e0,
             "The units in \'eqnTanh = pow(x, tanh(3.0))\' in component \'my_component\' are not equivalent. \'eqnTanh\' is in \'second\' while \'pow(x, tanh(3.0))\' is in \'second^0.995055\'."
             ,&local_a32);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c0,
             "The units in \'eqnSech = pow(x, sech(3.0))\' in component \'my_component\' are not equivalent. \'eqnSech\' is in \'second\' while \'pow(x, sech(3.0))\' is in \'second^0.0993279\'."
             ,&local_a33);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_4a0,
             "The units in \'eqnCsch = pow(x, csch(3.0))\' in component \'my_component\' are not equivalent. \'eqnCsch\' is in \'second\' while \'pow(x, csch(3.0))\' is in \'second^0.0998216\'."
             ,&local_a34);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_480,
             "The units in \'eqnCoth = pow(x, coth(3.0))\' in component \'my_component\' are not equivalent. \'eqnCoth\' is in \'second\' while \'pow(x, coth(3.0))\' is in \'second^1.00497\'."
             ,&local_a35);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_460,
             "The units in \'eqnArcsin = pow(x, arcsin(0.3))\' in component \'my_component\' are not equivalent. \'eqnArcsin\' is in \'second\' while \'pow(x, arcsin(0.3))\' is in \'second^0.304693\'."
             ,&local_a36);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_440,
             "The units in \'eqnArccos = pow(x, arccos(0.3))\' in component \'my_component\' are not equivalent. \'eqnArccos\' is in \'second\' while \'pow(x, arccos(0.3))\' is in \'second^1.2661\'."
             ,&local_a37);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_420,
             "The units in \'eqnArctan = pow(x, arctan(3.0))\' in component \'my_component\' are not equivalent. \'eqnArctan\' is in \'second\' while \'pow(x, arctan(3.0))\' is in \'second^1.24905\'."
             ,&local_a38);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_400,
             "The units in \'eqnArcsec = pow(x, arcsec(3.0))\' in component \'my_component\' are not equivalent. \'eqnArcsec\' is in \'second\' while \'pow(x, arcsec(3.0))\' is in \'second^1.23096\'."
             ,&local_a39);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e0,
             "The units in \'eqnArccsc = pow(x, arccsc(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccsc\' is in \'second\' while \'pow(x, arccsc(3.0))\' is in \'second^0.339837\'."
             ,&local_a3a);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3c0,
             "The units in \'eqnArccot = pow(x, arccot(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccot\' is in \'second\' while \'pow(x, arccot(3.0))\' is in \'second^0.321751\'."
             ,&local_a3b);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a0,
             "The units in \'eqnArcsinh = pow(x, arcsinh(3.0))\' in component \'my_component\' are not equivalent. \'eqnArcsinh\' is in \'second\' while \'pow(x, arcsinh(3.0))\' is in \'second^1.81845\'."
             ,&local_a3c);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_380,
             "The units in \'eqnArccosh = pow(x, arccosh(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccosh\' is in \'second\' while \'pow(x, arccosh(3.0))\' is in \'second^1.76275\'."
             ,&local_a3d);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_360,
             "The units in \'eqnArctanh = pow(x, arctanh(0.3))\' in component \'my_component\' are not equivalent. \'eqnArctanh\' is in \'second\' while \'pow(x, arctanh(0.3))\' is in \'second^0.30952\'."
             ,&local_a3e);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_340,
             "The units in \'eqnArcsech = pow(x, arcsech(0.3))\' in component \'my_component\' are not equivalent. \'eqnArcsech\' is in \'second\' while \'pow(x, arcsech(0.3))\' is in \'second^1.87382\'."
             ,&local_a3f);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_320,
             "The units in \'eqnArccsch = pow(x, arccsch(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccsch\' is in \'second\' while \'pow(x, arccsch(3.0))\' is in \'second^0.32745\'."
             ,&local_a40);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_300,
             "The units in \'eqnArccoth = pow(x, arccoth(3.0))\' in component \'my_component\' are not equivalent. \'eqnArccoth\' is in \'second\' while \'pow(x, arccoth(3.0))\' is in \'second^0.346574\'."
             ,&local_a41);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e0,
             "The units in \'eqnPiecewise = pow(x, (y > 5.0)?3.0:7.0)\' in component \'my_component\' may not be equivalent. \'eqnPiecewise\' is in \'second\' while \'(y > 5.0)?3.0:7.0\' may result in \'pow(x, (y > 5.0)?3.0:7.0)\' having different units."
             ,&local_a42);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c0,
             "The units in \'eqnCi = pow(x, y)\' in component \'my_component\' are not equivalent. \'eqnCi\' is in \'second\' while \'pow(x, y)\' is in \'second^3\'."
             ,&local_a43);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,
             "The units in \'eqnCi2 = pow(x, z)\' in component \'my_component\' are equivalent as long as the value of \'z\' is equal to \'1.0\'."
             ,&local_a44);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_280,
             "The units in \'eqnCi3 = pow(x, 3.0*z)\' in component \'my_component\' are equivalent as long as the value of \'3.0*z\' is equal to \'3.0\'."
             ,&local_a45);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_260,
             "The units in \'eqnCi4 = pow(x, y+z)\' in component \'my_component\' are equivalent as long as the value of \'y+z\' is equal to \'4.0\'."
             ,&local_a46);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_240,
             "The units in \'eqnCi5 = pow(x, pow(y-z, y-z)+1.0)\' in component \'my_component\' are equivalent as long as the value of \'pow(y-z, y-z)+1.0\' is equal to \'5.0\'."
             ,&local_a47);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_220,
             "The units in \'eqnCn = pow(x, 3.0)\' in component \'my_component\' are not equivalent. \'eqnCn\' is in \'second\' while \'pow(x, 3.0)\' is in \'second^3\'."
             ,&local_a48);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,
             "The units in \'eqnFalse = pow(x, false)\' in component \'my_component\' are not equivalent. \'eqnFalse\' is in \'second\' while \'pow(x, false)\' is \'dimensionless\'."
             ,&local_a49);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e0,
             "The units in \'eqnExponentiale = pow(x, exponentiale)\' in component \'my_component\' are not equivalent. \'eqnExponentiale\' is in \'second\' while \'pow(x, exponentiale)\' is in \'second^2.71828\'."
             ,&local_a4a);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c0,
             "The units in \'eqnPi = pow(x, pi)\' in component \'my_component\' are not equivalent. \'eqnPi\' is in \'second\' while \'pow(x, pi)\' is in \'second^3.14159\'."
             ,&local_a4b);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,
             "The units in \'eqnInfinity = pow(x, infinity)\' in component \'my_component\' are not equivalent. \'eqnInfinity\' is in \'second\' while \'pow(x, infinity)\' is in \'second^inf\' (i.e. \'10^nan x second^inf\')."
             ,&local_a4c);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_180,
             "The units in \'eqnNotanumber = pow(x, notanumber)\' in component \'my_component\' are not equivalent. \'eqnNotanumber\' is in \'second\' while \'pow(x, notanumber)\' is in \'second^nan\' (i.e. \'10^nan x second^nan\')."
             ,&local_a4d);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_160,"The type of variable \'u\' in component \'my_component\' is unknown.",
             &local_a4e);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,
             "The type of variable \'eqnCoverage\' in component \'my_component\' is unknown.",
             &local_a4f);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,
             "The type of variable \'eqnCoverage2\' in component \'my_component\' is unknown.",
             &local_a50);
  local_a08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,
             "The type of variable \'eqnCoverage3\' in component \'my_component\' is unknown.",
             (allocator<char> *)
             ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 0;
  local_e0 = &local_a00;
  local_d8 = 0x49;
  this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_01);
  __l._M_len = local_d8;
  __l._M_array = local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0,__l,this_01);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 5));
  local_f50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
  do {
    local_f50 = local_f50 + -1;
    std::__cxx11::string::~string((string *)local_f50);
  } while (local_f50 != &local_a00);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator(&local_a50);
  std::allocator<char>::~allocator(&local_a4f);
  std::allocator<char>::~allocator(&local_a4e);
  std::allocator<char>::~allocator(&local_a4d);
  std::allocator<char>::~allocator(&local_a4c);
  std::allocator<char>::~allocator(&local_a4b);
  std::allocator<char>::~allocator(&local_a4a);
  std::allocator<char>::~allocator(&local_a49);
  std::allocator<char>::~allocator(&local_a48);
  std::allocator<char>::~allocator(&local_a47);
  std::allocator<char>::~allocator(&local_a46);
  std::allocator<char>::~allocator(&local_a45);
  std::allocator<char>::~allocator(&local_a44);
  std::allocator<char>::~allocator(&local_a43);
  std::allocator<char>::~allocator(&local_a42);
  std::allocator<char>::~allocator(&local_a41);
  std::allocator<char>::~allocator(&local_a40);
  std::allocator<char>::~allocator(&local_a3f);
  std::allocator<char>::~allocator(&local_a3e);
  std::allocator<char>::~allocator(&local_a3d);
  std::allocator<char>::~allocator(&local_a3c);
  std::allocator<char>::~allocator(&local_a3b);
  std::allocator<char>::~allocator(&local_a3a);
  std::allocator<char>::~allocator(&local_a39);
  std::allocator<char>::~allocator(&local_a38);
  std::allocator<char>::~allocator(&local_a37);
  std::allocator<char>::~allocator(&local_a36);
  std::allocator<char>::~allocator(&local_a35);
  std::allocator<char>::~allocator(&local_a34);
  std::allocator<char>::~allocator(&local_a33);
  std::allocator<char>::~allocator(&local_a32);
  std::allocator<char>::~allocator(&local_a31);
  std::allocator<char>::~allocator(&local_a30);
  std::allocator<char>::~allocator(&local_a2f);
  std::allocator<char>::~allocator(&local_a2e);
  std::allocator<char>::~allocator(&local_a2d);
  std::allocator<char>::~allocator(&local_a2c);
  std::allocator<char>::~allocator(&local_a2b);
  std::allocator<char>::~allocator(&local_a2a);
  std::allocator<char>::~allocator(&local_a29);
  std::allocator<char>::~allocator(&local_a28);
  std::allocator<char>::~allocator(&local_a27);
  std::allocator<char>::~allocator(&local_a26);
  std::allocator<char>::~allocator(&local_a25);
  std::allocator<char>::~allocator(&local_a24);
  std::allocator<char>::~allocator(&local_a23);
  std::allocator<char>::~allocator(&local_a22);
  std::allocator<char>::~allocator(&local_a21);
  std::allocator<char>::~allocator(&local_a20);
  std::allocator<char>::~allocator(&local_a1f);
  std::allocator<char>::~allocator(&local_a1e);
  std::allocator<char>::~allocator(&local_a1d);
  std::allocator<char>::~allocator(&local_a1c);
  std::allocator<char>::~allocator(&local_a1b);
  std::allocator<char>::~allocator(&local_a1a);
  std::allocator<char>::~allocator(&local_a19);
  std::allocator<char>::~allocator(&local_a18);
  std::allocator<char>::~allocator(&local_a17);
  std::allocator<char>::~allocator(&local_a16);
  std::allocator<char>::~allocator(&local_a15);
  std::allocator<char>::~allocator(&local_a14);
  std::allocator<char>::~allocator(&local_a13);
  std::allocator<char>::~allocator(&local_a12);
  std::allocator<char>::~allocator(&local_a11);
  std::allocator<char>::~allocator(&local_a10);
  std::allocator<char>::~allocator(&local_a0f);
  std::allocator<char>::~allocator(&local_a0e);
  std::allocator<char>::~allocator(&local_a0d);
  std::allocator<char>::~allocator(&local_a0c);
  std::allocator<char>::~allocator(&local_a0b);
  std::allocator<char>::~allocator(&local_a0a);
  std::allocator<char>::~allocator(&local_a09);
  libcellml::Analyser::create();
  peVar3 = std::__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a68);
  libcellml::Analyser::analyseModel((shared_ptr *)peVar3);
  testing::ScopedTrace::ScopedTrace
            (&local_a69,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x380,"Issue occurred here.");
  std::shared_ptr<libcellml::Logger>::shared_ptr<libcellml::Analyser,void>
            (&local_a80,(shared_ptr<libcellml::Analyser> *)local_a68);
  expectEqualIssues((vector *)local_d0,(shared_ptr *)&local_a80);
  std::shared_ptr<libcellml::Logger>::~shared_ptr(&local_a80);
  testing::ScopedTrace::~ScopedTrace(&local_a69);
  std::shared_ptr<libcellml::Analyser>::~shared_ptr((shared_ptr<libcellml::Analyser> *)local_a68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(AnalyserUnits, powerValues)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/power_values.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The units in 'eqnEq = pow(x, 3.0 == 5.0)' in component 'my_component' are not equivalent. 'eqnEq' is in 'second' while 'pow(x, 3.0 == 5.0)' is 'dimensionless'.",
        "The units in 'eqnGt = pow(x, 3.0 > 5.0)' in component 'my_component' are not equivalent. 'eqnGt' is in 'second' while 'pow(x, 3.0 > 5.0)' is 'dimensionless'.",
        "The units in 'eqnGeq = pow(x, 3.0 >= 5.0)' in component 'my_component' are not equivalent. 'eqnGeq' is in 'second' while 'pow(x, 3.0 >= 5.0)' is 'dimensionless'.",
        "The units in 'eqnAnd2 = pow(x, !3.0 && 5.0)' in component 'my_component' are not equivalent. 'eqnAnd2' is in 'second' while 'pow(x, !3.0 && 5.0)' is 'dimensionless'.",
        "The units in 'eqnAnd3 = pow(x, 3.0 && !5.0)' in component 'my_component' are not equivalent. 'eqnAnd3' is in 'second' while 'pow(x, 3.0 && !5.0)' is 'dimensionless'.",
        "The units in 'eqnOr3 = pow(x, !3.0 || !5.0)' in component 'my_component' are not equivalent. 'eqnOr3' is in 'second' while 'pow(x, !3.0 || !5.0)' is 'dimensionless'.",
        "The units in 'eqnXor = pow(x, xor(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnXor' is in 'second' while 'pow(x, xor(3.0, 5.0))' is 'dimensionless'.",
        "The units in 'eqnNot = pow(x, !3.0)' in component 'my_component' are not equivalent. 'eqnNot' is in 'second' while 'pow(x, !3.0)' is 'dimensionless'.",
        "The units in 'eqnPlus = pow(x, 3.0)' in component 'my_component' are not equivalent. 'eqnPlus' is in 'second' while 'pow(x, 3.0)' is in 'second^3'.",
        "The units in 'eqnPlus2 = pow(x, 3.0+5.0)' in component 'my_component' are not equivalent. 'eqnPlus2' is in 'second' while 'pow(x, 3.0+5.0)' is in 'second^8'.",
        "The units in 'eqnMinus = pow(x, -3.0)' in component 'my_component' are not equivalent. 'eqnMinus' is in 'second' while 'pow(x, -3.0)' is in 'second^-3'.",
        "The units in 'eqnMinus2 = pow(x, 3.0-5.0)' in component 'my_component' are not equivalent. 'eqnMinus2' is in 'second' while 'pow(x, 3.0-5.0)' is in 'second^-2'.",
        "The units in 'eqnTimes = pow(x, 3.0*5.0)' in component 'my_component' are not equivalent. 'eqnTimes' is in 'second' while 'pow(x, 3.0*5.0)' is in 'second^15'.",
        "The units in 'eqnDivide = pow(x, 3.0/5.0)' in component 'my_component' are not equivalent. 'eqnDivide' is in 'second' while 'pow(x, 3.0/5.0)' is in 'second^0.6'.",
        "The units in 'eqnPower = pow(x, pow(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnPower' is in 'second' while 'pow(x, pow(3.0, 5.0))' is in 'second^243'.",
        "The units in 'eqnRoot = pow(x, pow(3.0, 1.0/5.0))' in component 'my_component' are not equivalent. 'eqnRoot' is in 'second' while 'pow(x, pow(3.0, 1.0/5.0))' is in 'second^1.24573'.",
        "The units in 'eqnRoot2 = pow(x, sqrt(3.0))' in component 'my_component' are not equivalent. 'eqnRoot2' is in 'second' while 'pow(x, sqrt(3.0))' is in 'second^1.73205'.",
        "The units in 'eqnAbs = pow(x, abs(-3.0))' in component 'my_component' are not equivalent. 'eqnAbs' is in 'second' while 'pow(x, abs(-3.0))' is in 'second^3'.",
        "The units in 'eqnExp = pow(x, exp(3.0))' in component 'my_component' are not equivalent. 'eqnExp' is in 'second' while 'pow(x, exp(3.0))' is in 'second^20.0855'.",
        "The units in 'eqnLn = pow(x, ln(3.0))' in component 'my_component' are not equivalent. 'eqnLn' is in 'second' while 'pow(x, ln(3.0))' is in 'second^1.09861'.",
        "The units in 'eqnLog = pow(x, log(3.0))' in component 'my_component' are not equivalent. 'eqnLog' is in 'second' while 'pow(x, log(3.0))' is in 'second^0.477121'.",
        "The units in 'eqnLog2 = pow(x, ln(3.0)/ln(2.0))' in component 'my_component' are not equivalent. 'eqnLog2' is in 'second' while 'pow(x, ln(3.0)/ln(2.0))' is in 'second^1.58496'.",
        "The units in 'eqnLog10 = pow(x, log(3.0))' in component 'my_component' are not equivalent. 'eqnLog10' is in 'second' while 'pow(x, log(3.0))' is in 'second^0.477121'.",
        "The units in 'eqnCeiling = pow(x, ceil(3.21))' in component 'my_component' are not equivalent. 'eqnCeiling' is in 'second' while 'pow(x, ceil(3.21))' is in 'second^4'.",
        "The units in 'eqnFloor = pow(x, floor(3.21))' in component 'my_component' are not equivalent. 'eqnFloor' is in 'second' while 'pow(x, floor(3.21))' is in 'second^3'.",
        "The units in 'eqnMin = pow(x, min(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnMin' is in 'second' while 'pow(x, min(3.0, 5.0))' is in 'second^3'.",
        "The units in 'eqnMin2 = pow(x, min(5.0, 3.0))' in component 'my_component' are not equivalent. 'eqnMin2' is in 'second' while 'pow(x, min(5.0, 3.0))' is in 'second^3'.",
        "The units in 'eqnMax = pow(x, max(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnMax' is in 'second' while 'pow(x, max(3.0, 5.0))' is in 'second^5'.",
        "The units in 'eqnMax2 = pow(x, max(5.0, 3.0))' in component 'my_component' are not equivalent. 'eqnMax2' is in 'second' while 'pow(x, max(5.0, 3.0))' is in 'second^5'.",
        "The units in 'eqnRem = pow(x, rem(3.0, 5.0))' in component 'my_component' are not equivalent. 'eqnRem' is in 'second' while 'pow(x, rem(3.0, 5.0))' is in 'second^3'.",
        "The units in 'eqnDiff = pow(x, dx/dt)' in component 'my_component' may not be equivalent. 'eqnDiff' is in 'second' while 'dx/dt' may result in 'pow(x, dx/dt)' having different units.",
        "The units in 'pow(x, dx/dt) = eqnDiff2' in component 'my_component' may not be equivalent. 'dx/dt' may result in 'pow(x, dx/dt)' having different units while 'eqnDiff2' is in 'second'.",
        "The units in 'pow(x, dx/dt) = pow(xx, dxx/dt)' in component 'my_component' may not be equivalent. 'dx/dt' may result in 'pow(x, dx/dt)' having different units while 'dxx/dt' may result in 'pow(xx, dxx/dt)' having different units.",
        "The units in 'eqnSin = pow(x, sin(3.0))' in component 'my_component' are not equivalent. 'eqnSin' is in 'second' while 'pow(x, sin(3.0))' is in 'second^0.14112'.",
        "The units in 'eqnCos = pow(x, cos(3.0))' in component 'my_component' are not equivalent. 'eqnCos' is in 'second' while 'pow(x, cos(3.0))' is in 'second^-0.989992'.",
        "The units in 'eqnTan = pow(x, tan(3.0))' in component 'my_component' are not equivalent. 'eqnTan' is in 'second' while 'pow(x, tan(3.0))' is in 'second^-0.142547'.",
        "The units in 'eqnSec = pow(x, sec(3.0))' in component 'my_component' are not equivalent. 'eqnSec' is in 'second' while 'pow(x, sec(3.0))' is in 'second^-1.01011'.",
        "The units in 'eqnCsc = pow(x, csc(3.0))' in component 'my_component' are not equivalent. 'eqnCsc' is in 'second' while 'pow(x, csc(3.0))' is in 'second^7.08617'.",
        "The units in 'eqnCot = pow(x, cot(3.0))' in component 'my_component' are not equivalent. 'eqnCot' is in 'second' while 'pow(x, cot(3.0))' is in 'second^-7.01525'.",
        "The units in 'eqnSinh = pow(x, sinh(3.0))' in component 'my_component' are not equivalent. 'eqnSinh' is in 'second' while 'pow(x, sinh(3.0))' is in 'second^10.0179'.",
        "The units in 'eqnCosh = pow(x, cosh(3.0))' in component 'my_component' are not equivalent. 'eqnCosh' is in 'second' while 'pow(x, cosh(3.0))' is in 'second^10.0677'.",
        "The units in 'eqnTanh = pow(x, tanh(3.0))' in component 'my_component' are not equivalent. 'eqnTanh' is in 'second' while 'pow(x, tanh(3.0))' is in 'second^0.995055'.",
        "The units in 'eqnSech = pow(x, sech(3.0))' in component 'my_component' are not equivalent. 'eqnSech' is in 'second' while 'pow(x, sech(3.0))' is in 'second^0.0993279'.",
        "The units in 'eqnCsch = pow(x, csch(3.0))' in component 'my_component' are not equivalent. 'eqnCsch' is in 'second' while 'pow(x, csch(3.0))' is in 'second^0.0998216'.",
        "The units in 'eqnCoth = pow(x, coth(3.0))' in component 'my_component' are not equivalent. 'eqnCoth' is in 'second' while 'pow(x, coth(3.0))' is in 'second^1.00497'.",
        "The units in 'eqnArcsin = pow(x, arcsin(0.3))' in component 'my_component' are not equivalent. 'eqnArcsin' is in 'second' while 'pow(x, arcsin(0.3))' is in 'second^0.304693'.",
        "The units in 'eqnArccos = pow(x, arccos(0.3))' in component 'my_component' are not equivalent. 'eqnArccos' is in 'second' while 'pow(x, arccos(0.3))' is in 'second^1.2661'.",
        "The units in 'eqnArctan = pow(x, arctan(3.0))' in component 'my_component' are not equivalent. 'eqnArctan' is in 'second' while 'pow(x, arctan(3.0))' is in 'second^1.24905'.",
        "The units in 'eqnArcsec = pow(x, arcsec(3.0))' in component 'my_component' are not equivalent. 'eqnArcsec' is in 'second' while 'pow(x, arcsec(3.0))' is in 'second^1.23096'.",
        "The units in 'eqnArccsc = pow(x, arccsc(3.0))' in component 'my_component' are not equivalent. 'eqnArccsc' is in 'second' while 'pow(x, arccsc(3.0))' is in 'second^0.339837'.",
        "The units in 'eqnArccot = pow(x, arccot(3.0))' in component 'my_component' are not equivalent. 'eqnArccot' is in 'second' while 'pow(x, arccot(3.0))' is in 'second^0.321751'.",
        "The units in 'eqnArcsinh = pow(x, arcsinh(3.0))' in component 'my_component' are not equivalent. 'eqnArcsinh' is in 'second' while 'pow(x, arcsinh(3.0))' is in 'second^1.81845'.",
        "The units in 'eqnArccosh = pow(x, arccosh(3.0))' in component 'my_component' are not equivalent. 'eqnArccosh' is in 'second' while 'pow(x, arccosh(3.0))' is in 'second^1.76275'.",
        "The units in 'eqnArctanh = pow(x, arctanh(0.3))' in component 'my_component' are not equivalent. 'eqnArctanh' is in 'second' while 'pow(x, arctanh(0.3))' is in 'second^0.30952'.",
        "The units in 'eqnArcsech = pow(x, arcsech(0.3))' in component 'my_component' are not equivalent. 'eqnArcsech' is in 'second' while 'pow(x, arcsech(0.3))' is in 'second^1.87382'.",
        "The units in 'eqnArccsch = pow(x, arccsch(3.0))' in component 'my_component' are not equivalent. 'eqnArccsch' is in 'second' while 'pow(x, arccsch(3.0))' is in 'second^0.32745'.",
        "The units in 'eqnArccoth = pow(x, arccoth(3.0))' in component 'my_component' are not equivalent. 'eqnArccoth' is in 'second' while 'pow(x, arccoth(3.0))' is in 'second^0.346574'.",
        "The units in 'eqnPiecewise = pow(x, (y > 5.0)?3.0:7.0)' in component 'my_component' may not be equivalent. 'eqnPiecewise' is in 'second' while '(y > 5.0)?3.0:7.0' may result in 'pow(x, (y > 5.0)?3.0:7.0)' having different units.",
        "The units in 'eqnCi = pow(x, y)' in component 'my_component' are not equivalent. 'eqnCi' is in 'second' while 'pow(x, y)' is in 'second^3'.",
        "The units in 'eqnCi2 = pow(x, z)' in component 'my_component' are equivalent as long as the value of 'z' is equal to '1.0'.",
        "The units in 'eqnCi3 = pow(x, 3.0*z)' in component 'my_component' are equivalent as long as the value of '3.0*z' is equal to '3.0'.",
        "The units in 'eqnCi4 = pow(x, y+z)' in component 'my_component' are equivalent as long as the value of 'y+z' is equal to '4.0'.",
        "The units in 'eqnCi5 = pow(x, pow(y-z, y-z)+1.0)' in component 'my_component' are equivalent as long as the value of 'pow(y-z, y-z)+1.0' is equal to '5.0'.",
        "The units in 'eqnCn = pow(x, 3.0)' in component 'my_component' are not equivalent. 'eqnCn' is in 'second' while 'pow(x, 3.0)' is in 'second^3'.",
        "The units in 'eqnFalse = pow(x, false)' in component 'my_component' are not equivalent. 'eqnFalse' is in 'second' while 'pow(x, false)' is 'dimensionless'.",
        "The units in 'eqnExponentiale = pow(x, exponentiale)' in component 'my_component' are not equivalent. 'eqnExponentiale' is in 'second' while 'pow(x, exponentiale)' is in 'second^2.71828'.",
        "The units in 'eqnPi = pow(x, pi)' in component 'my_component' are not equivalent. 'eqnPi' is in 'second' while 'pow(x, pi)' is in 'second^3.14159'.",
        "The units in 'eqnInfinity = pow(x, infinity)' in component 'my_component' are not equivalent. 'eqnInfinity' is in 'second' while 'pow(x, infinity)' is in 'second^inf' (i.e. '10^nan x second^inf').",
        "The units in 'eqnNotanumber = pow(x, notanumber)' in component 'my_component' are not equivalent. 'eqnNotanumber' is in 'second' while 'pow(x, notanumber)' is in 'second^nan' (i.e. '10^nan x second^nan').",
        "The type of variable 'u' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage2' in component 'my_component' is unknown.",
        "The type of variable 'eqnCoverage3' in component 'my_component' is unknown.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}